

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall OpenMPCriticalDirective::setCriticalName(OpenMPCriticalDirective *this,char *_name)

{
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,_name,&local_31);
  std::__cxx11::string::operator=((string *)&this->critical_name,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

OpenMPCriticalDirective( ) : OpenMPDirective(OMPD_critical) { }